

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::CloseOuters(SQVM *this,SQObjectPtr *stackindex)

{
  SQObjectPtr *in_RSI;
  long in_RDI;
  bool bVar1;
  SQOuter *p;
  SQObjectPtr *obj;
  
  while( true ) {
    obj = *(SQObjectPtr **)(in_RDI + 0x58);
    bVar1 = false;
    if (obj != (SQObjectPtr *)0x0) {
      bVar1 = in_RSI <= *(SQObjectPtr **)&obj[3].super_SQObject;
    }
    if (!bVar1) break;
    ::SQObjectPtr::operator=(in_RSI,obj);
    *(SQObjectPtr **)&obj[3].super_SQObject = obj + 4;
    *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)&obj[5].super_SQObject;
    if ((obj != (SQObjectPtr *)0x0) &&
       ((obj->super_SQObject)._unVal.pTable =
             (SQTable *)((obj->super_SQObject)._unVal.nInteger + -1),
       (obj->super_SQObject)._unVal.pTable == (SQTable *)0x0)) {
      (**(code **)(*(long *)&obj->super_SQObject + 0x10))();
    }
  }
  return;
}

Assistant:

void SQVM::CloseOuters(SQObjectPtr *stackindex) {
  SQOuter *p;
  while ((p = _openouters) != NULL && p->_valptr >= stackindex) {
    p->_value = *(p->_valptr);
    p->_valptr = &p->_value;
    _openouters = p->_next;
    __ObjRelease(p);
  }
}